

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O3

QVersionNumber __thiscall
QVersionNumber::commonPrefix(QVersionNumber *this,QVersionNumber *v1,QVersionNumber *v2)

{
  byte bVar1;
  byte bVar2;
  QList<int> *pQVar3;
  QList<int> *pQVar4;
  int iVar5;
  ulong size;
  ulong uVar6;
  int iVar7;
  
  bVar1 = (v1->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    uVar6 = (((v1->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    uVar6 = (ulong)((char)bVar1 >> 1);
  }
  bVar2 = (v2->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    size = (((v2->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    size = (ulong)((char)bVar2 >> 1);
  }
  if ((long)uVar6 < (long)size) {
    size = uVar6;
  }
  if ((long)size < 1) {
LAB_0038ab7d:
    (this->m_segments).field_0.dummy = 1;
  }
  else {
    pQVar3 = (v1->m_segments).field_0.pointer_segments;
    pQVar4 = (v2->m_segments).field_0.pointer_segments;
    uVar6 = 0;
    do {
      if ((bVar1 & 1) == 0) {
        if (uVar6 < (ulong)(pQVar3->d).size) {
          iVar5 = (pQVar3->d).ptr[uVar6];
        }
        else {
LAB_0038ab12:
          iVar5 = 0;
        }
      }
      else {
        if ((long)((char)bVar1 >> 1) <= (long)uVar6) goto LAB_0038ab12;
        iVar5 = (int)(v1->m_segments).field_0.inline_segments[uVar6 + 1];
      }
      if ((bVar2 & 1) == 0) {
        if (uVar6 < (ulong)(pQVar4->d).size) {
          iVar7 = (pQVar4->d).ptr[uVar6];
        }
        else {
LAB_0038ab36:
          iVar7 = 0;
        }
      }
      else {
        if ((long)((char)bVar2 >> 1) <= (long)uVar6) goto LAB_0038ab36;
        iVar7 = (int)(v2->m_segments).field_0.inline_segments[uVar6 + 1];
      }
      if (iVar5 != iVar7) {
        size = uVar6;
        if (uVar6 == 0) goto LAB_0038ab7d;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (size != uVar6);
    (this->m_segments).field_0.pointer_segments = (QList<int> *)&DAT_aaaaaaaaaaaaaaaa;
    if ((bVar1 & 1) == 0) {
      v1 = v2;
    }
    SegmentStorage::SegmentStorage(&this->m_segments,&v1->m_segments);
    if (((this->m_segments).field_0.inline_segments[0] & 1U) == 0) {
      QList<int>::resize((this->m_segments).field_0.pointer_segments,size);
    }
    else {
      (this->m_segments).field_0.inline_segments[0] = (char)size * '\x02' + '\x01';
    }
  }
  return (QVersionNumber)(SegmentStorage)this;
}

Assistant:

QVersionNumber QVersionNumber::commonPrefix(const QVersionNumber &v1,
                                            const QVersionNumber &v2)
{
    qsizetype commonlen = qMin(v1.segmentCount(), v2.segmentCount());
    qsizetype i;
    for (i = 0; i < commonlen; ++i) {
        if (v1.segmentAt(i) != v2.segmentAt(i))
            break;
    }

    if (i == 0)
        return QVersionNumber();

    // try to use the one with inline segments, if there's one
    QVersionNumber result(!v1.m_segments.isUsingPointer() ? v1 : v2);
    result.m_segments.resize(i);
    return result;
}